

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O1

void __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::erasenonleaf
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,int *cur,
          node **p,int *pp,locType *pos)

{
  locType *plVar1;
  unsigned_long_long *puVar2;
  int iVar3;
  locType *plVar4;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar5;
  size_t __n;
  int iVar6;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  node *pnVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  void *__dest;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  void *__dest_00;
  undefined8 uStack_a0;
  unsigned_long_long uStack_98;
  int local_8c;
  locType *local_88;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *local_80;
  undefined1 *local_78;
  int *local_70;
  ulong local_68;
  long local_60;
  unsigned_long_long *local_58;
  size_t local_50;
  node *local_48;
  int *local_40;
  uint local_34;
  
  iVar3 = *cur;
  pnVar7 = p[iVar3];
  iVar6 = pnVar7->sz;
  if (pp[iVar3] + 1 < iVar6) {
    lVar10 = (long)pp[iVar3] + 1;
    do {
      pnVar7->keyvalue[lVar10 + -1] = pnVar7->keyvalue[lVar10];
      (pnVar7->field_0).val[lVar10] = *(long *)((long)&pnVar7->field_0 + lVar10 * 8 + 8);
      lVar10 = lVar10 + 1;
      pnVar7 = p[iVar3];
      iVar6 = pnVar7->sz;
    } while (lVar10 < iVar6);
  }
  pnVar7->sz = iVar6 + -1;
  lVar10 = (long)*cur;
  if (lVar10 == 0) {
    if (iVar6 + -1 == 0) {
      this->depth = this->depth + -1;
      uStack_a0 = 0x10d7b9;
      DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
      ::release(this->file,this->root);
      this->root = pos[1];
      return;
    }
    pDVar11 = this->file;
    UNRECOVERED_JUMPTABLE =
         (pDVar11->
         super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
         )._vptr_FileManager_Base[3];
  }
  else {
    if (iVar6 < 0x32) {
      local_40 = pp;
      if (pp[lVar10 + -1] == p[lVar10 + -1]->sz) {
        p[lVar10 + 1] = p[lVar10];
        pp[lVar10 + 1] = pp[lVar10 + -1];
        lVar10 = (long)*cur;
        pos[lVar10 + 1] = pos[lVar10];
        pp[lVar10 + -1] = p[lVar10 + -1]->sz + -1;
        lVar10 = (long)*cur;
        pos[lVar10] = (p[lVar10 + -1]->field_0).val[pp[lVar10 + -1]];
        uStack_a0 = 0x10d3f0;
        iVar6 = (*(this->file->
                  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                  )._vptr_FileManager_Base[2])();
        p[*cur] = (node *)CONCAT44(extraout_var,iVar6);
      }
      else {
        pp[lVar10 + 1] = pp[lVar10 + -1] + 1;
        lVar10 = (long)*cur;
        pos[lVar10 + 1] = (p[lVar10 + -1]->field_0).val[pp[lVar10 + 1]];
        uStack_a0 = 0x10d429;
        iVar6 = (*(this->file->
                  super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                  )._vptr_FileManager_Base[2])();
        p[(long)*cur + 1] = (node *)CONCAT44(extraout_var_00,iVar6);
      }
      lVar10 = (long)*cur;
      iVar6 = p[iVar3]->sz;
      local_34 = p[lVar10 + 1]->sz + iVar6;
      if ((int)local_34 < 99) {
        p[iVar3]->keyvalue[iVar6] = p[lVar10 + -1]->keyvalue[local_40[lVar10 + -1]];
        pnVar7 = p[lVar10 + 1];
        iVar6 = pnVar7->sz;
        if (0 < iVar6) {
          lVar9 = 0;
          do {
            iVar6 = (int)lVar9;
            (p[iVar3]->field_0).val[p[iVar3]->sz + iVar6 + 1] = (pnVar7->field_0).val[lVar9];
            puVar2 = p[lVar10 + 1]->keyvalue + lVar9;
            lVar9 = lVar9 + 1;
            p[iVar3]->keyvalue[iVar6 + 1 + p[iVar3]->sz] = *puVar2;
            pnVar7 = p[lVar10 + 1];
            iVar6 = pnVar7->sz;
          } while (lVar9 < iVar6);
        }
        lVar10 = (pnVar7->field_0).val[iVar6];
        pnVar7 = p[iVar3];
        iVar3 = pnVar7->sz;
        pnVar7->sz = iVar6 + 1 + iVar3;
        *(long *)((long)&pnVar7->field_0 + ((long)iVar6 + (long)iVar3) * 8 + 8) = lVar10;
        uStack_a0 = 0x10d51b;
        (*(this->file->
          super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
          )._vptr_FileManager_Base[3])(this->file,pos + *cur);
        uStack_a0 = 0x10d52c;
        DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        ::release(this->file,pos[(long)*cur + 1]);
        local_8c = *cur + -1;
        uStack_a0 = 0x10d54c;
        erasenonleaf(this,&local_8c,p,local_40,pos);
      }
      else {
        local_80 = this;
        local_88 = pos;
        local_78 = (undefined1 *)&uStack_98;
        uVar13 = (ulong)local_34;
        lVar9 = -(uVar13 * 8 + 0x1f & 0xfffffffffffffff0);
        __dest = (void *)((long)&uStack_98 + lVar9);
        __dest_00 = (void *)((long)__dest - (uVar13 * 8 + 0x17 & 0xffffffff0));
        pnVar7 = p[iVar3];
        lVar14 = (long)pnVar7->sz;
        local_48 = pnVar7;
        if (0 < lVar14) {
          local_58 = pnVar7->keyvalue;
          local_70 = cur;
          local_68 = uVar13;
          local_60 = lVar14;
          local_50 = lVar14 * 8;
          *(undefined8 *)((long)__dest_00 + -8) = 0x10d5d6;
          memcpy(__dest,pnVar7,lVar14 * 8);
          __n = local_50;
          puVar2 = local_58;
          *(undefined8 *)((long)__dest_00 + -8) = 0x10d5e6;
          memcpy(__dest_00,puVar2,__n);
          uVar13 = local_68;
          cur = local_70;
          lVar14 = local_60;
        }
        uVar8 = local_34;
        *(long *)((long)__dest + lVar14 * 8) = (local_48->field_0).val[lVar14];
        *(unsigned_long_long *)((long)__dest_00 + lVar14 * 8) =
             p[(long)*cur + -1]->keyvalue[local_40[(long)*cur + -1]];
        if ((int)lVar14 < (int)uVar8) {
          pnVar7 = p[lVar10 + 1];
          lVar12 = 0;
          do {
            *(long *)((long)__dest + lVar12 * 8 + lVar14 * 8 + 8) =
                 (pnVar7->field_0).val[(int)lVar12];
            *(unsigned_long_long *)((long)__dest_00 + lVar12 * 8 + lVar14 * 8 + 8) =
                 pnVar7->keyvalue[(int)lVar12];
            lVar12 = lVar12 + 1;
          } while (uVar13 - lVar14 != lVar12);
        }
        pnVar7 = p[lVar10 + 1];
        lVar14 = (pnVar7->field_0).val[pnVar7->sz];
        *(long *)((long)__dest + (uVar13 + 1) * 8) = lVar14;
        pBVar5 = local_80;
        plVar4 = local_88;
        uVar8 = (uint)(uVar13 + 1 >> 1) & 0x7fffffff;
        local_48->sz = uVar8;
        pnVar7->sz = local_34 - uVar8;
        pnVar7 = p[iVar3];
        iVar6 = pnVar7->sz;
        if (0 < iVar6) {
          lVar12 = 0;
          do {
            (pnVar7->field_0).val[lVar12] = *(long *)((long)__dest + lVar12 * 8);
            pnVar7 = p[iVar3];
            pnVar7->keyvalue[lVar12] = *(unsigned_long_long *)((long)__dest_00 + lVar12 * 8);
            lVar12 = lVar12 + 1;
            iVar6 = pnVar7->sz;
          } while (lVar12 < iVar6);
        }
        (pnVar7->field_0).val[iVar6] = *(long *)((long)__dest + (long)iVar6 * 8);
        p[(long)*cur + -1]->keyvalue[local_40[(long)*cur + -1]] =
             *(unsigned_long_long *)((long)__dest_00 + (long)p[iVar3]->sz * 8);
        pnVar7 = p[lVar10 + 1];
        iVar6 = pnVar7->sz;
        if (0 < iVar6) {
          lVar12 = 0;
          do {
            (pnVar7->field_0).val[lVar12] =
                 *(long *)(&stack0xffffffffffffff70 + (p[iVar3]->sz + lVar12) * 8 + lVar9);
            pnVar7 = p[lVar10 + 1];
            pnVar7->keyvalue[lVar12] =
                 *(unsigned_long_long *)((long)__dest_00 + (p[iVar3]->sz + lVar12) * 8 + 8);
            lVar12 = lVar12 + 1;
            iVar6 = pnVar7->sz;
          } while (lVar12 < iVar6);
        }
        (pnVar7->field_0).val[iVar6] = lVar14;
        pDVar11 = local_80->file;
        plVar1 = local_88 + *cur;
        UNRECOVERED_JUMPTABLE =
             (pDVar11->
             super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
             )._vptr_FileManager_Base[3];
        *(undefined8 *)((long)__dest_00 + -8) = 0x10d779;
        (*UNRECOVERED_JUMPTABLE)(pDVar11,plVar1);
        pDVar11 = pBVar5->file;
        iVar3 = *cur;
        UNRECOVERED_JUMPTABLE =
             (pDVar11->
             super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
             )._vptr_FileManager_Base[3];
        *(undefined8 *)((long)__dest_00 + -8) = 0x10d78e;
        (*UNRECOVERED_JUMPTABLE)(pDVar11,plVar4 + (long)iVar3 + 1);
        pDVar11 = pBVar5->file;
        iVar3 = *cur;
        UNRECOVERED_JUMPTABLE =
             (pDVar11->
             super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
             )._vptr_FileManager_Base[3];
        *(undefined8 *)((long)__dest_00 + -8) = 0x10d7a3;
        (*UNRECOVERED_JUMPTABLE)(pDVar11,plVar4 + (long)iVar3 + -1);
      }
      return;
    }
    pDVar11 = this->file;
    pos = pos + lVar10;
    UNRECOVERED_JUMPTABLE =
         (pDVar11->
         super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
         )._vptr_FileManager_Base[3];
  }
  (*UNRECOVERED_JUMPTABLE)(pDVar11,pos);
  return;
}

Assistant:

void erasenonleaf(const int &cur, node **p, int *pp, locType *pos) {
            node *&x = p[cur];
            int i, j = pp[cur];
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->pointer[i] = x->pointer[i + 1];
            --x->sz;
            if (!cur) {
                if (!x->sz) {
                    --depth;
                    file->release(root);
                    root = pos[1];
                } else {
                    file->save(pos[0]);
                }
                return;
            }
            if (x->sz >= degree - 1 >> 1) {
                file->save(pos[cur]);
                return;
            }
            if (pp[cur - 1] == p[cur - 1]->sz) {
                p[cur + 1] = p[cur];
                pp[cur + 1] = pp[cur - 1];
                pos[cur + 1] = pos[cur];
                pp[cur - 1] = p[cur - 1]->sz - 1;
                pos[cur] = p[cur - 1]->pointer[pp[cur - 1]];
                p[cur] = file->read(pos[cur]);
            } else {
                pp[cur + 1] = pp[cur - 1] + 1;
                pos[cur + 1] = p[cur - 1]->pointer[pp[cur + 1]];
                p[cur + 1] = file->read(pos[cur + 1]);
            }
            node *&y = p[cur + 1];
            if (x->sz + y->sz < degree - 1) {
                x->keyvalue[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = 0; i < y->sz; ++i)
                    x->pointer[x->sz + 1 + i] = y->pointer[i], x->keyvalue[x->sz + 1 + i] = y->keyvalue[i];
                x->pointer[x->sz += 1 + y->sz] = y->pointer[y->sz];
                file->save(pos[cur]);
                file->release(pos[cur + 1]);
                erasenonleaf(cur - 1, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz + 1;
                locType tmpp[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpp[i] = x->pointer[i], tmpk[i] = x->keyvalue[i];
                tmpp[x->sz] = x->pointer[x->sz];
                tmpk[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = x->sz + 1; i < newsz; ++i)
                    tmpp[i] = y->pointer[i - x->sz - 1], tmpk[i] = y->keyvalue[i - x->sz - 1];
                tmpp[newsz] = y->pointer[y->sz];
                x->sz = newsz >> 1;
                y->sz = newsz - x->sz - 1;
                for (i = 0; i < x->sz; ++i)x->pointer[i] = tmpp[i], x->keyvalue[i] = tmpk[i];
                x->pointer[x->sz] = tmpp[x->sz];
                p[cur - 1]->keyvalue[pp[cur - 1]] = tmpk[x->sz];
                for (i = 0; i < y->sz; ++i)y->pointer[i] = tmpp[i + x->sz + 1], y->keyvalue[i] = tmpk[i + x->sz + 1];
                y->pointer[y->sz] = tmpp[newsz];
                file->save(pos[cur]);
                file->save(pos[cur + 1]);
                file->save(pos[cur - 1]);
            }
        }